

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O1

LY_ERR lyd_dup_inst_next(lyd_node **inst,lyd_node *siblings,ly_ht **dup_inst_ht)

{
  uint uVar1;
  uint uVar2;
  lysc_node *plVar3;
  LY_ERR LVar4;
  ly_ht *plVar5;
  LY_ERR LVar6;
  ly_set **set;
  lys_module *plVar7;
  lyd_dup_inst *item;
  lyd_dup_inst **item_p;
  ly_set **local_40;
  lyd_node *local_38;
  undefined8 *local_30;
  
  local_38 = *inst;
  LVar6 = LY_SUCCESS;
  if (local_38 == (lyd_node *)0x0) {
    return LY_SUCCESS;
  }
  if (*dup_inst_ht == (ly_ht *)0x0) {
    set = (ly_set **)0x0;
    plVar5 = lyht_new(2,8,lyht_dup_inst_ht_equal_cb,(void *)0x0,1);
    *dup_inst_ht = plVar5;
    if (plVar5 == (ly_ht *)0x0) goto LAB_0012747f;
  }
  else {
    LVar4 = lyht_find(*dup_inst_ht,&local_38,local_38->hash,&local_30);
    if (LVar4 == LY_SUCCESS) {
      set = (ly_set **)*local_30;
      goto LAB_0012747f;
    }
  }
  local_40 = (ly_set **)calloc(1,0x10);
  if (local_40 == (ly_set **)0x0) {
    set = (ly_set **)0x0;
  }
  else {
    LVar4 = lyht_insert(*dup_inst_ht,&local_40,local_38->hash,(void **)0x0);
    set = (ly_set **)0x0;
    if (LVar4 == LY_SUCCESS) {
      set = local_40;
    }
  }
LAB_0012747f:
  if (set == (ly_set **)0x0) {
    if (siblings->schema == (lysc_node *)0x0) {
      plVar7 = (lys_module *)&siblings[2].schema;
    }
    else {
      plVar7 = siblings->schema->module;
    }
    LVar6 = LY_EMEM;
    ly_log(plVar7->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_dup_inst_next");
  }
  else {
    if (*(int *)(set + 1) == 0) {
      lyd_find_sibling_dup_inst_set(siblings,*inst,set);
      if (((*set)->count == 0) || (*((*set)->field_2).dnodes != *inst)) {
        __assert_fail("dup_inst->set->count && (dup_inst->set->dnodes[0] == *inst)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                      ,0x7c,
                      "LY_ERR lyd_dup_inst_next(struct lyd_node **, const struct lyd_node *, struct ly_ht **)"
                     );
      }
    }
    uVar1 = *(uint *)(set + 1);
    uVar2 = (*set)->count;
    if (uVar1 == uVar2) {
      plVar3 = (*inst)->schema;
      if (plVar3 != (lysc_node *)0x0) {
        if (plVar3->nodetype == 8) {
          if ((plVar3->flags & 1) != 0) {
            return LY_SUCCESS;
          }
        }
        else {
          if (plVar3->nodetype != 0x10) {
            return LY_SUCCESS;
          }
          if ((plVar3->flags & 0x200) == 0) {
            return LY_SUCCESS;
          }
        }
        *inst = (lyd_node *)0x0;
      }
    }
    else {
      if (uVar2 <= uVar1) {
        __assert_fail("dup_inst->used < dup_inst->set->count",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                      ,0x85,
                      "LY_ERR lyd_dup_inst_next(struct lyd_node **, const struct lyd_node *, struct ly_ht **)"
                     );
      }
      *inst = ((*set)->field_2).dnodes[uVar1];
      *(uint *)(set + 1) = uVar1 + 1;
    }
  }
  return LVar6;
}

Assistant:

LY_ERR
lyd_dup_inst_next(struct lyd_node **inst, const struct lyd_node *siblings, struct ly_ht **dup_inst_ht)
{
    struct lyd_dup_inst *dup_inst;

    if (!*inst) {
        /* no match, inst is unchanged */
        return LY_SUCCESS;
    }

    /* there can be more exact same instances (even if not allowed in invalid data) and we must make sure we do not
     * match a single node more times */
    dup_inst = lyd_dup_inst_get(*inst, dup_inst_ht);
    LY_CHECK_ERR_RET(!dup_inst, LOGMEM(LYD_CTX(siblings)), LY_EMEM);

    if (!dup_inst->used) {
        /* we did not cache these instances yet, do so */
        lyd_find_sibling_dup_inst_set(siblings, *inst, &dup_inst->set);
        assert(dup_inst->set->count && (dup_inst->set->dnodes[0] == *inst));
    }

    if (dup_inst->used == dup_inst->set->count) {
        if (lysc_is_dup_inst_list((*inst)->schema)) {
            /* we have used all the instances */
            *inst = NULL;
        } /* else just keep using the last (ideally only) instance */
    } else {
        assert(dup_inst->used < dup_inst->set->count);

        /* use another instance */
        *inst = dup_inst->set->dnodes[dup_inst->used];
        ++dup_inst->used;
    }

    return LY_SUCCESS;
}